

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  int in_ECX;
  int *in_RDX;
  Table *in_RSI;
  FKey *in_RDI;
  FKey *p;
  bool local_31;
  FKey *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((ulong)in_RDI->pFrom->zColAff & 0x8000000000000) != 0) {
    if (in_RDX == (int *)0x0) {
      pFVar2 = sqlite3FkReferences((Table *)0x19f932);
      local_31 = true;
      if (pFVar2 == (FKey *)0x0) {
        local_31 = in_RSI->pFKey != (FKey *)0x0;
      }
      return (uint)local_31;
    }
    for (local_30 = in_RSI->pFKey; local_30 != (FKey *)0x0; local_30 = local_30->pNextFrom) {
      iVar1 = fkChildIsModified(in_RSI,local_30,in_RDX,in_ECX);
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (local_30 = sqlite3FkReferences((Table *)0x19f9bd); local_30 != (FKey *)0x0;
        local_30 = local_30->pNextTo) {
      iVar1 = fkParentIsModified((Table *)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),in_RDI,(int *)in_RSI,
                                 (int)((ulong)in_RDX >> 0x20));
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }
    }
  }
  return 0;
}